

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::GenerateRegionSyntax::setChild
          (GenerateRegionSyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  Info *pIVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar6;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar7;
  SyntaxList<slang::syntax::MemberSyntax> *pSVar8;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar9;
  logic_error *this_00;
  long *plVar10;
  size_type *psVar11;
  long *plVar12;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (index < 4) {
    switch(index) {
    case 0:
      ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pSVar6 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                         (*ppSVar7);
      (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
           (pSVar6->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
           (pSVar6->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
           (pSVar6->super_SyntaxListBase).childCount;
      sVar1 = (pSVar6->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
              .size_;
      (this->super_MemberSyntax).attributes.
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
           (pSVar6->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
           data_;
      (this->super_MemberSyntax).attributes.
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
      break;
    case 1:
      pvVar9 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                         ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                          &child);
      uVar3 = pvVar9->field_0x2;
      NVar4.raw = (pvVar9->numFlags).raw;
      uVar5 = pvVar9->rawLen;
      pIVar2 = pvVar9->info;
      (this->keyword).kind = pvVar9->kind;
      (this->keyword).field_0x2 = uVar3;
      (this->keyword).numFlags = (NumericTokenFlags)NVar4.raw;
      (this->keyword).rawLen = uVar5;
      (this->keyword).info = pIVar2;
      break;
    case 2:
      ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pSVar8 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::MemberSyntax>>(*ppSVar7);
      (this->members).super_SyntaxListBase.super_SyntaxNode.parent =
           (pSVar8->super_SyntaxListBase).super_SyntaxNode.parent;
      (this->members).super_SyntaxListBase.super_SyntaxNode.kind =
           (pSVar8->super_SyntaxListBase).super_SyntaxNode.kind;
      (this->members).super_SyntaxListBase.childCount = (pSVar8->super_SyntaxListBase).childCount;
      sVar1 = (pSVar8->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).size_;
      (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.data_ =
           (pSVar8->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).data_;
      (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.size_ =
           sVar1;
      break;
    case 3:
      pvVar9 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                         ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                          &child);
      uVar3 = pvVar9->field_0x2;
      NVar4.raw = (pvVar9->numFlags).raw;
      uVar5 = pvVar9->rawLen;
      pIVar2 = pvVar9->info;
      (this->endgenerate).kind = pvVar9->kind;
      (this->endgenerate).field_0x2 = uVar3;
      (this->endgenerate).numFlags = (NumericTokenFlags)NVar4.raw;
      (this->endgenerate).rawLen = uVar5;
      (this->endgenerate).info = pIVar2;
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O3/extern/slang/source/AllSyntax.cpp"
             ,"");
  plVar10 = (long *)std::__cxx11::string::append((char *)local_d0);
  local_b0._M_dataplus._M_p = (pointer)*plVar10;
  psVar11 = (size_type *)(plVar10 + 2);
  if ((size_type *)local_b0._M_dataplus._M_p == psVar11) {
    local_b0.field_2._M_allocated_capacity = *psVar11;
    local_b0.field_2._8_8_ = plVar10[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar11;
  }
  local_b0._M_string_length = plVar10[1];
  *plVar10 = (long)psVar11;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::__cxx11::to_string(&local_70,0x1999);
  std::operator+(&local_50,&local_b0,&local_70);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_90 = (long *)*plVar10;
  plVar12 = plVar10 + 2;
  if (local_90 == plVar12) {
    local_80 = *plVar12;
    lStack_78 = plVar10[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar12;
  }
  local_88 = plVar10[1];
  *plVar10 = (long)plVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_f0 = (long *)*plVar10;
  plVar12 = plVar10 + 2;
  if (local_f0 == plVar12) {
    local_e0 = *plVar12;
    lStack_d8 = plVar10[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar12;
  }
  local_e8 = plVar10[1];
  *plVar10 = (long)plVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::logic_error::logic_error(this_00,(string *)&local_f0);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void GenerateRegionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: keyword = child.token(); return;
        case 2: members = child.node()->as<SyntaxList<MemberSyntax>>(); return;
        case 3: endgenerate = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}